

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvapeeki.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  nva_card **ppnVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  undefined1 *puVar9;
  int32_t b;
  int32_t a;
  int cnum;
  uint32_t z [64];
  undefined1 auStack_148 [4];
  int local_144;
  uint local_140;
  int local_13c;
  uint local_138 [66];
  
  iVar4 = nva_init();
  if (iVar4 == 0) {
    local_13c = 0;
    do {
      while (iVar4 = getopt(argc,argv,"c:"), iVar4 == 99) {
        __isoc99_sscanf(_optarg,"%d",&local_13c);
      }
    } while (iVar4 != -1);
    if (local_13c < nva_cardsnum) {
      local_144 = 4;
      if (_optind < argc) {
        __isoc99_sscanf(argv[_optind],"%x",&local_140);
        local_140 = local_140 & 0xfffffffc;
        if (_optind + 1 < argc) {
          __isoc99_sscanf(argv[(long)_optind + 1],"%x",&local_144);
        }
        if (local_144 < 1) {
          return 0;
        }
        bVar2 = true;
        do {
          ppnVar3 = nva_cards;
          uVar6 = 0;
          uVar5 = 0;
          do {
            *(int *)((long)ppnVar3[local_13c]->bar0 + ((ulong)local_140 | 0xffc)) = (int)uVar6;
            uVar7 = *(uint *)((long)ppnVar3[local_13c]->bar0 + (ulong)local_140);
            local_138[uVar6] = uVar7;
            if (uVar7 != 0) {
              uVar7 = 1 << ((byte)(uVar6 >> 2) & 0x1f);
            }
            uVar5 = uVar5 | uVar7;
            uVar6 = uVar6 + 1;
          } while (uVar6 != 0x40);
          *(undefined4 *)((long)nva_cards[local_13c]->bar0 + ((ulong)local_140 | 0xffc)) = 0;
          lVar8 = 0;
          puVar9 = auStack_148;
          do {
            puVar9 = puVar9 + 0x10;
            if ((uVar5 >> ((uint)lVar8 & 0x1f) & 1) == 0) {
              if (bVar2) {
                puts("...");
              }
              bVar2 = false;
            }
            else {
              printf("%08x.%02x:",(ulong)local_140,(ulong)((uint)lVar8 << 4));
              if (0 < local_144) {
                uVar6 = 0;
                do {
                  printf(" %08x",(ulong)*(uint *)(puVar9 + uVar6 * 4));
                  if (2 < uVar6) break;
                  uVar6 = uVar6 + 1;
                } while ((long)uVar6 < (long)local_144);
              }
              putchar(10);
              bVar2 = true;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 != 0x10);
          local_140 = local_140 + 4;
          bVar1 = local_144 < 5;
          local_144 = local_144 + -4;
          if (bVar1) {
            return 0;
          }
        } while( true );
      }
      main_cold_4();
    }
    else if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	while ((c = getopt (argc, argv, "c:")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	int32_t a, b = 4, i;
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);
	a &= ~3;
	if (optind + 1 < argc)
		sscanf (argv[optind + 1], "%x", &b);
	int ls = 1;
	while (b > 0) {
		uint32_t selector = a|0xffc;
		uint32_t z[0x40];
		int s = 0, j;
		for (i = 0; i < 0x40; i++) {
			nva_wr32(cnum, selector, i);
			if ((z[i] = nva_rd32(cnum, a))) s |= 1 << (i/4);
		}
		nva_wr32(cnum, selector, 0);
		for (j = 0; j < 0x10; ++j) {
			if (s & (1<<j)) {
				ls = 1;
				printf ("%08x.%02x:", a, j * 0x10);
				for (i = 0; i < 4 && i < b; i++) {
					printf (" %08x", z[i + j*4]);
				}
				printf ("\n");
			} else  {
				if (ls) printf ("...\n"), ls = 0;
			}
		}
		a+=4;
		b-=4;
	}
	return 0;
}